

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::render(SRGBTestCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  deUint32 dVar6;
  deBool dVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  ObjectWrapper *this_00;
  reference ppSVar10;
  size_type sVar11;
  reference ppSVar12;
  undefined8 uVar13;
  TestError *this_01;
  reference ppSVar14;
  ulong local_38;
  size_t textureSourceIdx_1;
  int samplerIdx;
  int local_1c;
  GLuint samplerUniformLocationID;
  int textureSourceIdx;
  Functions *gl;
  SRGBTestCase *this_local;
  long lVar9;
  
  pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  pcVar1 = *(code **)(lVar9 + 0x78);
  this_00 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             ::operator*(&(this->m_framebuffer).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        )->super_ObjectWrapper;
  dVar4 = glu::ObjectWrapper::operator*(this_00);
  (*pcVar1)(0x8d40,dVar4);
  (**(code **)(lVar9 + 0xd8))(this->m_vaoID);
  pcVar1 = *(code **)(lVar9 + 0x1680);
  ppSVar10 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
             ::operator[](&this->m_shaderProgramList,0);
  GVar5 = SRGBTestProgram::getHandle(*ppSVar10);
  (*pcVar1)(GVar5);
  local_1c = 0;
  do {
    sVar11 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
             ::size(&this->m_textureSourceList);
    if ((int)sVar11 <= local_1c) {
      textureSourceIdx_1._0_4_ = 0;
      while( true ) {
        sVar11 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                 ::size(&this->m_samplerList);
        if ((int)sVar11 <= (int)textureSourceIdx_1) break;
        ppSVar14 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                   ::operator[](&this->m_samplerList,(long)(int)textureSourceIdx_1);
        bVar2 = SRGBTestSampler::getIsActive(*ppSVar14);
        if (bVar2) {
          ppSVar14 = std::
                     vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                     ::operator[](&this->m_samplerList,(long)(int)textureSourceIdx_1);
          SRGBTestSampler::bindToTexture(*ppSVar14);
        }
        textureSourceIdx_1._0_4_ = (int)textureSourceIdx_1 + 1;
      }
      (**(code **)(lVar9 + 0x538))(4,0,6);
      local_38 = 0;
      while( true ) {
        sVar11 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                 ::size(&this->m_textureSourceList);
        if (sVar11 <= local_38) break;
        pcVar1 = *(code **)(lVar9 + 0xb8);
        ppSVar12 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                   ::operator[](&this->m_textureSourceList,local_38);
        dVar4 = SRGBTestTexture::getGLTargetType(*ppSVar12);
        (*pcVar1)(dVar4);
        local_38 = local_38 + 1;
      }
      (**(code **)(lVar9 + 0x78))(0x8d40,0);
      (**(code **)(lVar9 + 0xd8))(0);
      (**(code **)(lVar9 + 0x40))(0x8892,0);
      return;
    }
    (**(code **)(lVar9 + 8))(local_1c + 0x84c0);
    pcVar1 = *(code **)(lVar9 + 0xb8);
    ppSVar12 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
               ::operator[](&this->m_textureSourceList,(long)local_1c);
    dVar4 = SRGBTestTexture::getGLTargetType(*ppSVar12);
    ppSVar12 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
               ::operator[](&this->m_textureSourceList,(long)local_1c);
    dVar6 = SRGBTestTexture::getHandle(*ppSVar12);
    (*pcVar1)(dVar4,dVar6);
    pcVar1 = *(code **)(lVar9 + 0xb48);
    ppSVar10 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
               ::operator[](&this->m_shaderProgramList,0);
    GVar5 = SRGBTestProgram::getHandle(*ppSVar10);
    ppSVar10 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
               ::operator[](&this->m_shaderProgramList,0);
    SRGBTestProgram::getUniformAtLocation(*ppSVar10,local_1c);
    uVar13 = std::__cxx11::string::c_str();
    iVar3 = (*pcVar1)(GVar5,uVar13);
    do {
      dVar7 = ::deGetFalse();
      if ((dVar7 != 0) || (iVar3 == -1)) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"samplerUniformLocationID != (glw::GLuint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                   ,0x52a);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    (**(code **)(lVar9 + 0x14f0))(iVar3);
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void SRGBTestCase::render (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// default rendering only uses one program
	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_framebuffer);
	gl.bindVertexArray(m_vaoID);

	gl.useProgram(m_shaderProgramList[0]->getHandle());

	for (int textureSourceIdx = 0; textureSourceIdx < (int)m_textureSourceList.size(); textureSourceIdx++)
	{
		gl.activeTexture(GL_TEXTURE0 + (glw::GLenum)textureSourceIdx);
		gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), m_textureSourceList[textureSourceIdx]->getHandle());
		glw::GLuint samplerUniformLocationID = gl.getUniformLocation(m_shaderProgramList[0]->getHandle(), m_shaderProgramList[0]->getUniformAtLocation(textureSourceIdx).name.c_str());
		TCU_CHECK(samplerUniformLocationID != (glw::GLuint)-1);
		gl.uniform1i(samplerUniformLocationID, (glw::GLenum)textureSourceIdx);
	}

	for (int samplerIdx = 0; samplerIdx < (int)m_samplerList.size(); samplerIdx++)
	{
		if (m_samplerList[samplerIdx]->getIsActive() == true)
		{
			m_samplerList[samplerIdx]->bindToTexture();
		}
	}

	gl.drawArrays(GL_TRIANGLES, 0, 6);

	for (std::size_t textureSourceIdx = 0; textureSourceIdx < m_textureSourceList.size(); textureSourceIdx++)
	{
		gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), 0);
	}
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
}